

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

int Wln_RetRemoveOneFanout(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int local_30;
  int iFlop1;
  int iFlop;
  int *pLink;
  int local_18;
  int iFanin;
  int k;
  int iObj_local;
  Wln_Ret_t *p_local;
  
  local_30 = -1;
  local_18 = 0;
  do {
    iVar1 = Wln_ObjRefs(p->pNtk,iObj);
    bVar4 = false;
    if (local_18 < iVar1) {
      piVar3 = Wln_RetFanouts(p,iObj);
      pLink._4_4_ = piVar3[local_18 << 1];
      piVar3 = Wln_RetFanouts(p,iObj);
      _iFlop1 = Vec_IntEntryP(&p->vFanins,piVar3[local_18 * 2 + 1]);
      bVar4 = _iFlop1 != (int *)0x0;
    }
    if (!bVar4) {
      return local_30;
    }
    if (pLink._4_4_ != 0) {
      if (*_iFlop1 == 0) {
        __assert_fail("pLink[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                      ,0x1bf,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
      }
      _iFlop1 = Wln_RetHeadToTail(p,_iFlop1);
      iVar1 = Vec_IntEntry(&p->vEdgeLinks,*_iFlop1 + 1);
      *_iFlop1 = 0;
      iVar2 = Wln_ObjIsFf(p->pNtk,iVar1);
      if (iVar2 == 0) {
        __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                      ,0x1c3,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
      }
      if (local_30 == -1) {
        local_30 = iVar1;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int Wln_RetRemoveOneFanout( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    //int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanout( p, iObj, iFanin, pLink, k )
    {
        assert( pLink[0] );
        pLink = Wln_RetHeadToTail( p, pLink );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pLink[0] = 0;
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}